

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverRemoveDontCareLits(Mvc_Cover_t *pCover)

{
  Mvc_Cover_t *pMVar1;
  Mvc_Cube_t *local_20;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCoverNew;
  Mvc_Cover_t *pCover_local;
  
  pMVar1 = Mvc_CoverDup(pCover);
  for (local_20 = (pMVar1->lCubes).pHead; local_20 != (Mvc_Cube_t *)0x0; local_20 = local_20->pNext)
  {
    Mvc_CubeBitRemoveDcs(local_20);
  }
  return pMVar1;
}

Assistant:

Mvc_Cover_t * Mvc_CoverRemoveDontCareLits( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pCoverNew;
    Mvc_Cube_t * pCube;

    pCoverNew = Mvc_CoverDup( pCover );
    Mvc_CoverForEachCube( pCoverNew, pCube )
        Mvc_CubeBitRemoveDcs( pCube );
    return pCoverNew;
}